

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_identity(lysp_yang_ctx *ctx,lysp_ident **identities)

{
  LY_ERR LVar1;
  lysp_ident *str_p;
  char *pcVar2;
  ly_ctx *local_d8;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_b0;
  char *local_a8;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  undefined8 *puStack_58;
  LY_ERR ret__;
  char *p__;
  lysp_ident *ident;
  size_t sStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_ident **pplStack_20;
  LY_ERR ret;
  lysp_ident **identities_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_20 = identities;
  identities_local = (lysp_ident **)ctx;
  if (*identities == (lysp_ident *)0x0) {
    puStack_58 = (undefined8 *)malloc(0x40);
    if (puStack_58 == (undefined8 *)0x0) {
      if (identities_local == (lysp_ident **)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   **(undefined8 **)
                     (&identities_local[7]->iffeatures->str)
                     [*(int *)((long)&identities_local[7]->name + 4) - 1];
      }
      ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_identity");
      return LY_EMEM;
    }
    *puStack_58 = 1;
  }
  else {
    *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + 1;
    puStack_58 = (undefined8 *)
                 realloc(&(*identities)[-1].flags,*(long *)&(*identities)[-1].flags * 0x38 + 8);
    if (puStack_58 == (undefined8 *)0x0) {
      *(long *)&(*pplStack_20)[-1].flags = *(long *)&(*pplStack_20)[-1].flags + -1;
      if (identities_local == (lysp_ident **)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = (ly_ctx *)
                   **(undefined8 **)
                     (&identities_local[7]->iffeatures->str)
                     [*(int *)((long)&identities_local[7]->name + 4) - 1];
      }
      ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_identity");
      return LY_EMEM;
    }
  }
  *pplStack_20 = (lysp_ident *)(puStack_58 + 1);
  str_p = *pplStack_20 + *(long *)&(*pplStack_20)[-1].flags + -1;
  memset(str_p,0,0x38);
  LVar1 = get_argument((lysp_yang_ctx *)identities_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffc0);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word == (char *)0x0) {
    if (identities_local == (lysp_ident **)0x0) {
      local_98 = (ly_ctx *)0x0;
    }
    else {
      local_98 = (ly_ctx *)
                 **(undefined8 **)
                   (&identities_local[7]->iffeatures->str)
                   [*(int *)((long)&identities_local[7]->name + 4) - 1];
    }
    if (sStack_40 == 0) {
      local_a8 = "";
    }
    else {
      local_a8 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_98,local_a8,sStack_40,&str_p->name);
  }
  else {
    if (identities_local == (lysp_ident **)0x0) {
      local_90 = (ly_ctx *)0x0;
    }
    else {
      local_90 = (ly_ctx *)
                 **(undefined8 **)
                   (&identities_local[7]->iffeatures->str)
                   [*(int *)((long)&identities_local[7]->name + 4) - 1];
    }
    buf._4_4_ = lydict_insert_zc(local_90,(char *)word_len,&str_p->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)identities_local,(ly_stmt *)((long)&ident + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
    if (buf._4_4_ == LY_SUCCESS) {
      if (ident._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar1 = buf._4_4_;
      }
      else {
        if (ident._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (identities_local == (lysp_ident **)0x0) {
            local_b0 = (ly_ctx *)0x0;
          }
          else {
            local_b0 = (ly_ctx *)
                       **(undefined8 **)
                         (&identities_local[7]->iffeatures->str)
                         [*(int *)((long)&identities_local[7]->name + 4) - 1];
          }
          pcVar2 = lyplg_ext_stmt2str(ident._4_4_);
          ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          return LY_EVALID;
        }
        LVar1 = get_keyword((lysp_yang_ctx *)identities_local,(ly_stmt *)((long)&ident + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        ret___2._3_1_ = ident._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar1 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar1, !(bool)ret___2._3_1_) {
        if (ident._4_4_ == LY_STMT_BASE) {
          if ((str_p->bases != (char **)0x0) &&
             ((byte)(&identities_local[7]->iffeatures->str)
                    [*(int *)((long)&identities_local[7]->name + 4) - 1][0x78] < 2)) {
            if (identities_local == (lysp_ident **)0x0) {
              local_d0 = (ly_ctx *)0x0;
            }
            else {
              local_d0 = (ly_ctx *)
                         **(undefined8 **)
                           (&identities_local[7]->iffeatures->str)
                           [*(int *)((long)&identities_local[7]->name + 4) - 1];
            }
            ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Identity can be derived from multiple base identities only in YANG 1.1 modules"
                   );
            return LY_EVALID;
          }
          LVar1 = parse_text_fields((lysp_yang_ctx *)identities_local,LY_STMT_BASE,&str_p->bases,
                                    Y_PREF_IDENTIF_ARG,&str_p->exts);
        }
        else if (ident._4_4_ == LY_STMT_DESCRIPTION) {
          LVar1 = parse_text_field((lysp_yang_ctx *)identities_local,str_p->dsc,LY_STMT_DESCRIPTION,
                                   0,&str_p->dsc,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        else if (ident._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          LVar1 = parse_ext((lysp_yang_ctx *)identities_local,(char *)word_len,sStack_40,str_p,
                            LY_STMT_IDENTITY,0,&str_p->exts);
        }
        else if (ident._4_4_ == LY_STMT_IF_FEATURE) {
          if ((byte)(&identities_local[7]->iffeatures->str)
                    [*(int *)((long)&identities_local[7]->name + 4) - 1][0x78] < 2) {
            if (identities_local == (lysp_ident **)0x0) {
              local_c8 = (ly_ctx *)0x0;
            }
            else {
              local_c8 = (ly_ctx *)
                         **(undefined8 **)
                           (&identities_local[7]->iffeatures->str)
                           [*(int *)((long)&identities_local[7]->name + 4) - 1];
            }
            ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"if-feature","identity");
            return LY_EVALID;
          }
          LVar1 = parse_qnames((lysp_yang_ctx *)identities_local,LY_STMT_IF_FEATURE,
                               &str_p->iffeatures,Y_STR_ARG,&str_p->exts);
        }
        else if (ident._4_4_ == LY_STMT_REFERENCE) {
          LVar1 = parse_text_field((lysp_yang_ctx *)identities_local,str_p->ref,LY_STMT_REFERENCE,0,
                                   &str_p->ref,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        else {
          if (ident._4_4_ != LY_STMT_STATUS) {
            if (identities_local == (lysp_ident **)0x0) {
              local_d8 = (ly_ctx *)0x0;
            }
            else {
              local_d8 = (ly_ctx *)
                         **(undefined8 **)
                           (&identities_local[7]->iffeatures->str)
                           [*(int *)((long)&identities_local[7]->name + 4) - 1];
            }
            pcVar2 = lyplg_ext_stmt2str(ident._4_4_);
            ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"identity");
            return LY_EVALID;
          }
          LVar1 = parse_status((lysp_yang_ctx *)identities_local,&str_p->flags,&str_p->exts);
        }
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)identities_local,(ly_stmt *)((long)&ident + 4),
                                (char **)&word_len,&stack0xffffffffffffffc0);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar1 = LY_SUCCESS;
        if (ident._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((str_p->exts != (lysp_ext_instance *)0x0) &&
             (LVar1 = ly_set_add((ly_set *)&identities_local[8]->exts,str_p->exts,'\x01',
                                 (uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
            return LVar1;
          }
          buf._4_4_ = LVar1;
          ret___2._3_1_ = true;
          LVar1 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_identity(struct lysp_yang_ctx *ctx, struct lysp_ident **identities)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_ident *ident;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *identities, ident, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, ident->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, ident->dsc, LY_STMT_DESCRIPTION, 0, &ident->dsc, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "identity");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &ident->iffeatures, Y_STR_ARG, &ident->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, ident->ref, LY_STMT_REFERENCE, 0, &ident->ref, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &ident->flags, &ident->exts));
            break;
        case LY_STMT_BASE:
            if (ident->bases && (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1)) {
                LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG,
                        "Identity can be derived from multiple base identities only in YANG 1.1 modules");
                return LY_EVALID;
            }
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &ident->bases, Y_PREF_IDENTIF_ARG, &ident->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, ident, LY_STMT_IDENTITY, 0, &ident->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "identity");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, ident->exts, ret, cleanup);
    }

cleanup:
    return ret;
}